

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall icu_63::RBBITableBuilder::removeSafeState(RBBITableBuilder *this,IntPair duplStates)

{
  short sVar1;
  char16_t cVar2;
  UChar c;
  int iVar3;
  UnicodeString *this_00;
  int index;
  int32_t offset;
  int32_t iVar4;
  uint index_00;
  
  index_00 = duplStates.second;
  UVector::removeElementAt(this->fSafeTable,index_00);
  iVar3 = this->fSafeTable->count;
  index = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; index != iVar3; index = index + 1) {
    this_00 = (UnicodeString *)UVector::elementAt(this->fSafeTable,index);
    sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this_00->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    offset = 0;
    if (iVar4 < 1) {
      iVar4 = offset;
    }
    for (; iVar4 != offset; offset = offset + 1) {
      cVar2 = UnicodeString::doCharAt(this_00,offset);
      c = cVar2 - (ushort)((int)index_00 < (int)(uint)(ushort)cVar2);
      if ((ushort)cVar2 == index_00) {
        c = (UChar)duplStates.first;
      }
      UnicodeString::setCharAt(this_00,offset,c);
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::removeSafeState(IntPair duplStates) {
    const int32_t keepState = duplStates.first;
    const int32_t duplState = duplStates.second;
    U_ASSERT(keepState < duplState);
    U_ASSERT(duplState < fSafeTable->size());

    fSafeTable->removeElementAt(duplState);   // Note that fSafeTable has a deleter function
                                              // and will auto-delete the removed element.
    int32_t numStates = fSafeTable->size();
    for (int32_t state=0; state<numStates; ++state) {
        UnicodeString *sd = (UnicodeString *)fSafeTable->elementAt(state);
        int32_t numCols = sd->length();
        for (int32_t col=0; col<numCols; col++) {
            int32_t existingVal = sd->charAt(col);
            int32_t newVal = existingVal;
            if (existingVal == duplState) {
                newVal = keepState;
            } else if (existingVal > duplState) {
                newVal = existingVal - 1;
            }
            sd->setCharAt(col, static_cast<char16_t>(newVal));
        }
    }
}